

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_4::Validator::CheckModule(Validator *this)

{
  Module *pMVar1;
  uint uVar2;
  ModuleFieldMixin<(wabt::ModuleFieldType)2> *pMVar3;
  ModuleFieldMixin<(wabt::ModuleFieldType)0> *pMVar4;
  ModuleFieldMixin<(wabt::ModuleFieldType)10> *pMVar5;
  ModuleFieldMixin<(wabt::ModuleFieldType)3> *pMVar6;
  ModuleFieldMixin<(wabt::ModuleFieldType)9> *pMVar7;
  ModuleFieldMixin<(wabt::ModuleFieldType)6> *pMVar8;
  ModuleFieldMixin<(wabt::ModuleFieldType)8> *pMVar9;
  bool bVar10;
  TypeEntryKind TVar11;
  ExternalKind EVar12;
  ExprType EVar13;
  Result RVar14;
  TypeModuleField *pTVar15;
  pointer pTVar16;
  FuncType *pFVar17;
  Type *pTVar18;
  size_type sVar19;
  Type *result_types;
  pointer this_00;
  TypeMut *fields;
  ArrayType *pAVar20;
  pointer pIVar21;
  FuncImport *pFVar22;
  TableImport *pTVar23;
  MemoryImport *pMVar24;
  GlobalImport *pGVar25;
  EventImport *pEVar26;
  TableModuleField *pTVar27;
  MemoryModuleField *pMVar28;
  GlobalModuleField *pGVar29;
  VarExpr<(wabt::ExprType)34> *pVVar30;
  ElemExprVector *this_01;
  Var *loc;
  size_type sVar31;
  reference pMVar32;
  FuncModuleField *pFVar33;
  Decls *this_02;
  reference ppVar34;
  const_reference pvVar35;
  ConstExpr *pCVar36;
  VarExpr<(wabt::ExprType)18> *pVVar37;
  const_iterator cVar38;
  Var local_a48;
  Enum local_9fc;
  undefined1 local_9f8 [8];
  Var var_2;
  Expr *expr_2;
  Enum local_954;
  DataSegmentModuleField *local_950;
  DataSegmentModuleField *f_11;
  ModuleField *field_12;
  intrusive_list<wabt::ModuleField> *local_938;
  undefined1 local_930 [8];
  const_iterator __end2_11;
  const_iterator __begin2_11;
  ModuleFieldList *__range2_11;
  undefined1 local_900 [8];
  ExprVisitor visitor;
  pair<wabt::Type,_unsigned_int> *decl;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  Decls *__range4_1;
  FuncModuleField *f_10;
  ModuleField *field_11;
  const_iterator __end2_10;
  const_iterator __begin2_10;
  ModuleFieldList *__range2_10;
  undefined1 local_830 [4];
  Index func_index;
  Enum local_7e8;
  Enum local_7e4;
  reference local_7e0;
  ElemExpr *elem_expr;
  const_iterator __end4;
  const_iterator __begin4;
  ElemExprVector *__range4;
  Var local_7b8;
  Enum local_76c;
  undefined1 local_768 [8];
  Var var_1;
  Expr *expr_1;
  Var local_708;
  Enum local_6bc;
  ElemSegmentModuleField *local_6b8;
  ElemSegmentModuleField *f_9;
  ModuleField *field_10;
  intrusive_list<wabt::ModuleField> *local_6a0;
  undefined1 local_698 [8];
  const_iterator __end2_9;
  const_iterator __begin2_9;
  ModuleFieldList *__range2_9;
  Enum local_624;
  StartModuleField *local_620;
  StartModuleField *f_8;
  ModuleField *field_9;
  intrusive_list<wabt::ModuleField> *local_608;
  undefined1 local_600 [8];
  const_iterator __end2_8;
  const_iterator __begin2_8;
  ModuleFieldList *__range2_8;
  Var local_5c8;
  Enum local_57c;
  ExportModuleField *local_578;
  ExportModuleField *f_7;
  ModuleField *field_8;
  intrusive_list<wabt::ModuleField> *local_560;
  undefined1 local_558 [8];
  const_iterator __end2_7;
  const_iterator __begin2_7;
  ModuleFieldList *__range2_7;
  Enum local_4e4;
  EventModuleField *local_4e0;
  EventModuleField *f_6;
  ModuleField *field_7;
  intrusive_list<wabt::ModuleField> *local_4c8;
  undefined1 local_4c0 [8];
  const_iterator __end2_6;
  const_iterator __begin2_6;
  ModuleFieldList *__range2_6;
  Var local_488;
  Enum local_43c;
  Var local_438;
  Enum local_3ec;
  undefined1 local_3e8 [8];
  Var var;
  Expr *expr;
  GlobalModuleField *f_5;
  ModuleField *field_6;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  ModuleFieldList *__range2_5;
  MemoryModuleField *f_4;
  ModuleField *field_5;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  ModuleFieldList *__range2_4;
  TableModuleField *f_3;
  ModuleField *field_4;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  ModuleFieldList *__range2_3;
  Enum local_254;
  FuncModuleField *local_250;
  FuncModuleField *f_2;
  ModuleField *field_3;
  intrusive_list<wabt::ModuleField> *local_238;
  undefined1 local_230 [8];
  const_iterator __end2_2;
  const_iterator __begin2_2;
  ModuleFieldList *__range2_2;
  Enum local_1bc;
  Event *local_1b8;
  Event *event;
  Global *local_1a8;
  Global *global;
  Memory *local_198;
  Memory *memory;
  Table *local_188;
  Table *table;
  Enum local_134;
  Func *local_130;
  Func *func;
  ImportModuleField *f_1;
  ModuleField *field_2;
  intrusive_list<wabt::ModuleField> *local_110;
  undefined1 local_108 [8];
  const_iterator __end2_1;
  const_iterator __begin2_1;
  ModuleFieldList *__range2_1;
  uint uStack_d8;
  ArrayType *array_type;
  value_type local_c0;
  reference local_b8;
  Field *field_1;
  iterator __end5;
  iterator __begin5;
  vector<wabt::Field,_std::allocator<wabt::Field>_> *__range5;
  TypeMutVector type_muts;
  StructType *struct_type;
  FuncType *func_type;
  TypeModuleField *f;
  ModuleField *field;
  const_iterator __end2;
  const_iterator __begin2;
  ModuleFieldList *__range2;
  Module *module;
  Validator *this_local;
  
  pMVar1 = this->current_module_;
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&pMVar1->fields);
  cVar38 = intrusive_list<wabt::ModuleField>::end(&pMVar1->fields);
  while (bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                            ((const_iterator *)&__end2.node_,cVar38), bVar10) {
    pMVar32 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)&__end2.node_);
    pTVar15 = dyn_cast<wabt::TypeModuleField,wabt::ModuleField>(pMVar32);
    if (pTVar15 != (TypeModuleField *)0x0) {
      pTVar16 = std::unique_ptr<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>::operator->
                          (&pTVar15->type);
      TVar11 = TypeEntry::kind(pTVar16);
      if (TVar11 == Func) {
        pTVar16 = std::unique_ptr<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>::get
                            (&pTVar15->type);
        pFVar17 = cast<wabt::FuncType,wabt::TypeEntry>(pTVar16);
        sVar31 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                           (&(pFVar17->sig).param_types);
        pTVar18 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::data
                            (&(pFVar17->sig).param_types);
        sVar19 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                           (&(pFVar17->sig).result_types);
        result_types = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::data
                                 (&(pFVar17->sig).result_types);
        RVar14 = SharedValidator::OnFuncType
                           (&this->validator_,&pMVar32->loc,(Index)sVar31,pTVar18,(Index)sVar19,
                            result_types);
        Result::operator|=(&this->result_,RVar14);
      }
      else if (TVar11 == Struct) {
        pTVar16 = std::unique_ptr<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>::get
                            (&pTVar15->type);
        type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)cast<wabt::StructType,wabt::TypeEntry>(pTVar16);
        std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::vector
                  ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)&__range5);
        this_00 = type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage + 10;
        __end5 = std::vector<wabt::Field,_std::allocator<wabt::Field>_>::begin
                           ((vector<wabt::Field,_std::allocator<wabt::Field>_> *)this_00);
        field_1 = (Field *)std::vector<wabt::Field,_std::allocator<wabt::Field>_>::end
                                     ((vector<wabt::Field,_std::allocator<wabt::Field>_> *)this_00);
        while (bVar10 = __gnu_cxx::operator!=
                                  (&__end5,(__normal_iterator<wabt::Field_*,_std::vector<wabt::Field,_std::allocator<wabt::Field>_>_>
                                            *)&field_1), bVar10) {
          local_b8 = __gnu_cxx::
                     __normal_iterator<wabt::Field_*,_std::vector<wabt::Field,_std::allocator<wabt::Field>_>_>
                     ::operator*(&__end5);
          local_c0.type.enum_ = (local_b8->type).enum_;
          local_c0.mutable_ = (bool)(local_b8->mutable_ & 1);
          std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::push_back
                    ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)&__range5,&local_c0);
          __gnu_cxx::
          __normal_iterator<wabt::Field_*,_std::vector<wabt::Field,_std::allocator<wabt::Field>_>_>
          ::operator++(&__end5);
        }
        sVar31 = std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::size
                           ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)&__range5);
        fields = std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::data
                           ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)&__range5);
        RVar14 = SharedValidator::OnStructType(&this->validator_,&pMVar32->loc,(Index)sVar31,fields)
        ;
        Result::operator|=(&this->result_,RVar14);
        std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::~vector
                  ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)&__range5);
      }
      else if (TVar11 == Array) {
        pTVar16 = std::unique_ptr<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>::get
                            (&pTVar15->type);
        pAVar20 = cast<wabt::ArrayType,wabt::TypeEntry>(pTVar16);
        uVar2 = CONCAT31(uStack_d8._1_3_,(pAVar20->field).mutable_);
        uStack_d8 = uVar2 & 0xffffff01;
        RVar14 = SharedValidator::OnArrayType
                           (&this->validator_,&pMVar32->loc,
                            (TypeMut)(CONCAT44(uVar2,(pAVar20->field).type.enum_) &
                                     0xffffff01ffffffff));
        Result::operator|=(&this->result_,RVar14);
      }
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2.node_);
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&pMVar1->fields);
  _local_108 = intrusive_list<wabt::ModuleField>::end(&pMVar1->fields);
  while( true ) {
    field_2 = (ModuleField *)local_108;
    local_110 = __end2_1.list_;
    bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                       ((const_iterator *)&__end2_1.node_,_local_108);
    if (!bVar10) break;
    f_1 = (ImportModuleField *)
          intrusive_list<wabt::ModuleField>::const_iterator::operator*
                    ((const_iterator *)&__end2_1.node_);
    func = (Func *)dyn_cast<wabt::ImportModuleField,wabt::ModuleField>((ModuleField *)f_1);
    if (func != (Func *)0x0) {
      pIVar21 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::operator->
                          ((unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_> *)
                           ((long)&(func->decl).type_var.loc.field_1 + 8));
      EVar12 = Import::kind(pIVar21);
      switch(EVar12) {
      case First:
        pIVar21 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                            ((unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_> *)
                             ((long)&(func->decl).type_var.loc.field_1 + 8));
        pFVar22 = cast<wabt::FuncImport,wabt::Import>(pIVar21);
        local_130 = &pFVar22->func;
        pMVar3 = &f_1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>;
        GetFuncTypeIndex((Var *)&table,this,
                         &(f_1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
                          loc,&(pFVar22->func).decl);
        local_134 = (Enum)SharedValidator::OnFunction
                                    (&this->validator_,&(pMVar3->super_ModuleField).loc,
                                     (Var *)&table);
        Result::operator|=(&this->result_,(Result)local_134);
        Var::~Var((Var *)&table);
        break;
      case Table:
        pIVar21 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                            ((unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_> *)
                             ((long)&(func->decl).type_var.loc.field_1 + 8));
        pTVar23 = cast<wabt::TableImport,wabt::Import>(pIVar21);
        local_188 = &pTVar23->table;
        memory._0_4_ = (pTVar23->table).elem_type.enum_;
        memory._4_4_ = SharedValidator::OnTable
                                 (&this->validator_,
                                  &(f_1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                                   super_ModuleField.loc,memory._0_4_,&(pTVar23->table).elem_limits)
        ;
        Result::operator|=(&this->result_,memory._4_4_);
        break;
      case Memory:
        pIVar21 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                            ((unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_> *)
                             ((long)&(func->decl).type_var.loc.field_1 + 8));
        pMVar24 = cast<wabt::MemoryImport,wabt::Import>(pIVar21);
        local_198 = &pMVar24->memory;
        global._4_4_ = SharedValidator::OnMemory
                                 (&this->validator_,
                                  &(f_1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                                   super_ModuleField.loc,&(pMVar24->memory).page_limits);
        Result::operator|=(&this->result_,global._4_4_);
        break;
      case Global:
        pIVar21 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                            ((unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_> *)
                             ((long)&(func->decl).type_var.loc.field_1 + 8));
        pGVar25 = cast<wabt::GlobalImport,wabt::Import>(pIVar21);
        local_1a8 = &pGVar25->global;
        event._0_4_ = (pGVar25->global).type.enum_;
        event._4_4_ = SharedValidator::OnGlobalImport
                                (&this->validator_,
                                 &(f_1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                                  super_ModuleField.loc,event._0_4_,
                                 (bool)((pGVar25->global).mutable_ & 1));
        Result::operator|=(&this->result_,event._4_4_);
        break;
      case Event:
        pIVar21 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                            ((unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_> *)
                             ((long)&(func->decl).type_var.loc.field_1 + 8));
        pEVar26 = cast<wabt::EventImport,wabt::Import>(pIVar21);
        local_1b8 = &pEVar26->event;
        pMVar3 = &f_1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>;
        GetFuncTypeIndex((Var *)&__range2_2,this,
                         &(f_1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
                          loc,&(pEVar26->event).decl);
        local_1bc = (Enum)SharedValidator::OnEvent
                                    (&this->validator_,&(pMVar3->super_ModuleField).loc,
                                     (Var *)&__range2_2);
        Result::operator|=(&this->result_,(Result)local_1bc);
        Var::~Var((Var *)&__range2_2);
      }
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_1.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&pMVar1->fields);
  _local_230 = intrusive_list<wabt::ModuleField>::end(&pMVar1->fields);
  while( true ) {
    field_3 = (ModuleField *)local_230;
    local_238 = __end2_2.list_;
    bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                       ((const_iterator *)&__end2_2.node_,_local_230);
    if (!bVar10) break;
    f_2 = (FuncModuleField *)
          intrusive_list<wabt::ModuleField>::const_iterator::operator*
                    ((const_iterator *)&__end2_2.node_);
    local_250 = dyn_cast<wabt::FuncModuleField,wabt::ModuleField>((ModuleField *)f_2);
    if (local_250 != (FuncModuleField *)0x0) {
      pMVar4 = &f_2->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>;
      GetFuncTypeIndex((Var *)&__range2_3,this,
                       &(f_2->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.
                        loc,&(local_250->func).decl);
      local_254 = (Enum)SharedValidator::OnFunction
                                  (&this->validator_,&(pMVar4->super_ModuleField).loc,
                                   (Var *)&__range2_3);
      Result::operator|=(&this->result_,(Result)local_254);
      Var::~Var((Var *)&__range2_3);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_2.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&pMVar1->fields);
  cVar38 = intrusive_list<wabt::ModuleField>::end(&pMVar1->fields);
  while (bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                            ((const_iterator *)&__end2_3.node_,cVar38), bVar10) {
    pMVar32 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)&__end2_3.node_);
    pTVar27 = dyn_cast<wabt::TableModuleField,wabt::ModuleField>(pMVar32);
    if (pTVar27 != (TableModuleField *)0x0) {
      RVar14 = SharedValidator::OnTable
                         (&this->validator_,&pMVar32->loc,(Type)(pTVar27->table).elem_type.enum_,
                          &(pTVar27->table).elem_limits);
      Result::operator|=(&this->result_,RVar14);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_3.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&pMVar1->fields);
  cVar38 = intrusive_list<wabt::ModuleField>::end(&pMVar1->fields);
  while (bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                            ((const_iterator *)&__end2_4.node_,cVar38), bVar10) {
    pMVar32 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)&__end2_4.node_);
    pMVar28 = dyn_cast<wabt::MemoryModuleField,wabt::ModuleField>(pMVar32);
    if (pMVar28 != (MemoryModuleField *)0x0) {
      RVar14 = SharedValidator::OnMemory
                         (&this->validator_,&pMVar32->loc,&(pMVar28->memory).page_limits);
      Result::operator|=(&this->result_,RVar14);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_4.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&pMVar1->fields);
  cVar38 = intrusive_list<wabt::ModuleField>::end(&pMVar1->fields);
  while (bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                            ((const_iterator *)&__end2_5.node_,cVar38), bVar10) {
    pMVar32 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)&__end2_5.node_);
    pGVar29 = dyn_cast<wabt::GlobalModuleField,wabt::ModuleField>(pMVar32);
    if (pGVar29 != (GlobalModuleField *)0x0) {
      RVar14 = SharedValidator::OnGlobal
                         (&this->validator_,&pMVar32->loc,(Type)(pGVar29->global).type.enum_,
                          (bool)((pGVar29->global).mutable_ & 1));
      Result::operator|=(&this->result_,RVar14);
      sVar31 = intrusive_list<wabt::Expr>::size(&(pGVar29->global).init_expr);
      if (sVar31 == 1) {
        pvVar35 = intrusive_list<wabt::Expr>::front(&(pGVar29->global).init_expr);
        EVar13 = Expr::type(pvVar35);
        switch(EVar13) {
        case Const:
          pCVar36 = cast<wabt::ConstExpr,wabt::Expr>(pvVar35);
          var.field_2._24_4_ = Const::type(&pCVar36->const_);
          var.field_2._28_4_ =
               (Index)SharedValidator::OnGlobalInitExpr_Const
                                (&this->validator_,&pvVar35->loc,var.field_2._24_4_);
          Result::operator|=(&this->result_,(Result)var.field_2._28_4_);
          break;
        default:
          RVar14 = SharedValidator::OnGlobalInitExpr_Other(&this->validator_,&pMVar32->loc);
          Result::operator|=(&this->result_,RVar14);
          break;
        case GlobalGet:
          pVVar37 = cast<wabt::VarExpr<(wabt::ExprType)18>,wabt::Expr>(pvVar35);
          Var::Var((Var *)local_3e8,&pVVar37->var);
          Var::Var(&local_438,(Var *)local_3e8);
          local_3ec = (Enum)SharedValidator::OnGlobalInitExpr_GlobalGet
                                      (&this->validator_,&pvVar35->loc,&local_438);
          Result::operator|=(&this->result_,(Result)local_3ec);
          Var::~Var(&local_438);
          Var::~Var((Var *)local_3e8);
          break;
        case RefFunc:
          pVVar30 = cast<wabt::VarExpr<(wabt::ExprType)34>,wabt::Expr>(pvVar35);
          Var::Var(&local_488,&pVVar30->var);
          local_43c = (Enum)SharedValidator::OnGlobalInitExpr_RefFunc
                                      (&this->validator_,&pvVar35->loc,&local_488);
          Result::operator|=(&this->result_,(Result)local_43c);
          Var::~Var(&local_488);
          break;
        case RefNull:
          RVar14 = SharedValidator::OnGlobalInitExpr_RefNull(&this->validator_,&pvVar35->loc);
          Result::operator|=(&this->result_,RVar14);
        }
      }
      else {
        RVar14 = SharedValidator::OnGlobalInitExpr_Other(&this->validator_,&pMVar32->loc);
        Result::operator|=(&this->result_,RVar14);
      }
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_5.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&pMVar1->fields);
  _local_4c0 = intrusive_list<wabt::ModuleField>::end(&pMVar1->fields);
  while( true ) {
    field_7 = (ModuleField *)local_4c0;
    local_4c8 = __end2_6.list_;
    bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                       ((const_iterator *)&__end2_6.node_,_local_4c0);
    if (!bVar10) break;
    f_6 = (EventModuleField *)
          intrusive_list<wabt::ModuleField>::const_iterator::operator*
                    ((const_iterator *)&__end2_6.node_);
    local_4e0 = dyn_cast<wabt::EventModuleField,wabt::ModuleField>((ModuleField *)f_6);
    if (local_4e0 != (EventModuleField *)0x0) {
      pMVar5 = &f_6->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>;
      GetFuncTypeIndex((Var *)&__range2_7,this,
                       &(f_6->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
                        loc,&(local_4e0->event).decl);
      local_4e4 = (Enum)SharedValidator::OnEvent
                                  (&this->validator_,&(pMVar5->super_ModuleField).loc,
                                   (Var *)&__range2_7);
      Result::operator|=(&this->result_,(Result)local_4e4);
      Var::~Var((Var *)&__range2_7);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_6.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&pMVar1->fields);
  _local_558 = intrusive_list<wabt::ModuleField>::end(&pMVar1->fields);
  while( true ) {
    field_8 = (ModuleField *)local_558;
    local_560 = __end2_7.list_;
    bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                       ((const_iterator *)&__end2_7.node_,_local_558);
    if (!bVar10) break;
    f_7 = (ExportModuleField *)
          intrusive_list<wabt::ModuleField>::const_iterator::operator*
                    ((const_iterator *)&__end2_7.node_);
    local_578 = dyn_cast<wabt::ExportModuleField,wabt::ModuleField>((ModuleField *)f_7);
    if (local_578 != (ExportModuleField *)0x0) {
      pMVar6 = &f_7->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>;
      EVar12 = (local_578->export_).kind;
      Var::Var(&local_5c8,&(local_578->export_).var);
      string_view::string_view((string_view *)&__range2_8,&(local_578->export_).name);
      local_57c = (Enum)SharedValidator::OnExport
                                  (&this->validator_,&(pMVar6->super_ModuleField).loc,EVar12,
                                   &local_5c8,___range2_8);
      Result::operator|=(&this->result_,(Result)local_57c);
      Var::~Var(&local_5c8);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_7.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&pMVar1->fields);
  _local_600 = intrusive_list<wabt::ModuleField>::end(&pMVar1->fields);
  while( true ) {
    field_9 = (ModuleField *)local_600;
    local_608 = __end2_8.list_;
    bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                       ((const_iterator *)&__end2_8.node_,_local_600);
    if (!bVar10) break;
    f_8 = (StartModuleField *)
          intrusive_list<wabt::ModuleField>::const_iterator::operator*
                    ((const_iterator *)&__end2_8.node_);
    local_620 = dyn_cast<wabt::StartModuleField,wabt::ModuleField>((ModuleField *)f_8);
    if (local_620 != (StartModuleField *)0x0) {
      pMVar7 = &f_8->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>;
      Var::Var((Var *)&__range2_9,&local_620->start);
      local_624 = (Enum)SharedValidator::OnStart
                                  (&this->validator_,&(pMVar7->super_ModuleField).loc,
                                   (Var *)&__range2_9);
      Result::operator|=(&this->result_,(Result)local_624);
      Var::~Var((Var *)&__range2_9);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_8.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&pMVar1->fields);
  _local_698 = intrusive_list<wabt::ModuleField>::end(&pMVar1->fields);
  while( true ) {
    field_10 = (ModuleField *)local_698;
    local_6a0 = __end2_9.list_;
    bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                       ((const_iterator *)&__end2_9.node_,_local_698);
    if (!bVar10) break;
    f_9 = (ElemSegmentModuleField *)
          intrusive_list<wabt::ModuleField>::const_iterator::operator*
                    ((const_iterator *)&__end2_9.node_);
    local_6b8 = dyn_cast<wabt::ElemSegmentModuleField,wabt::ModuleField>((ModuleField *)f_9);
    if (local_6b8 != (ElemSegmentModuleField *)0x0) {
      pMVar8 = &f_9->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>;
      Var::Var(&local_708,&(local_6b8->elem_segment).table_var);
      local_6bc = (Enum)SharedValidator::OnElemSegment
                                  (&this->validator_,&(pMVar8->super_ModuleField).loc,&local_708,
                                   (local_6b8->elem_segment).kind);
      Result::operator|=(&this->result_,(Result)local_6bc);
      Var::~Var(&local_708);
      SharedValidator::OnElemSegmentElemType
                (&this->validator_,(Type)(local_6b8->elem_segment).elem_type.enum_);
      sVar31 = intrusive_list<wabt::Expr>::size(&(local_6b8->elem_segment).offset);
      if (sVar31 == 1) {
        pvVar35 = intrusive_list<wabt::Expr>::front(&(local_6b8->elem_segment).offset);
        EVar13 = Expr::type(pvVar35);
        if (EVar13 == Const) {
          pCVar36 = cast<wabt::ConstExpr,wabt::Expr>(pvVar35);
          var_1.field_2._24_4_ = Const::type(&pCVar36->const_);
          var_1.field_2._28_4_ =
               (Index)SharedValidator::OnElemSegmentInitExpr_Const
                                (&this->validator_,&pvVar35->loc,var_1.field_2._24_4_);
          Result::operator|=(&this->result_,(Result)var_1.field_2._28_4_);
        }
        else if (EVar13 == GlobalGet) {
          pVVar37 = cast<wabt::VarExpr<(wabt::ExprType)18>,wabt::Expr>(pvVar35);
          Var::Var((Var *)local_768,&pVVar37->var);
          Var::Var(&local_7b8,(Var *)local_768);
          local_76c = (Enum)SharedValidator::OnElemSegmentInitExpr_GlobalGet
                                      (&this->validator_,&pvVar35->loc,&local_7b8);
          Result::operator|=(&this->result_,(Result)local_76c);
          Var::~Var(&local_7b8);
          Var::~Var((Var *)local_768);
        }
        else {
          RVar14 = SharedValidator::OnElemSegmentInitExpr_Other
                             (&this->validator_,
                              &(f_9->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
                               super_ModuleField.loc);
          Result::operator|=(&this->result_,RVar14);
        }
      }
      else {
        sVar31 = intrusive_list<wabt::Expr>::size(&(local_6b8->elem_segment).offset);
        if (1 < sVar31) {
          RVar14 = SharedValidator::OnElemSegmentInitExpr_Other
                             (&this->validator_,
                              &(f_9->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
                               super_ModuleField.loc);
          Result::operator|=(&this->result_,RVar14);
        }
      }
      this_01 = &(local_6b8->elem_segment).elem_exprs;
      __end4 = std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::begin(this_01);
      elem_expr = (ElemExpr *)
                  std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::end(this_01);
      while (bVar10 = __gnu_cxx::operator!=
                                (&__end4,(__normal_iterator<const_wabt::ElemExpr_*,_std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>_>
                                          *)&elem_expr), bVar10) {
        local_7e0 = __gnu_cxx::
                    __normal_iterator<const_wabt::ElemExpr_*,_std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>_>
                    ::operator*(&__end4);
        if (local_7e0->kind == RefNull) {
          local_7e4 = (Enum)SharedValidator::OnElemSegmentElemExpr_RefNull
                                      (&this->validator_,
                                       &(f_9->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
                                        super_ModuleField.loc);
          Result::operator|=(&this->result_,(Result)local_7e4);
        }
        else if (local_7e0->kind == RefFunc) {
          loc = &local_7e0->var;
          Var::Var((Var *)local_830,&local_7e0->var);
          local_7e8 = (Enum)SharedValidator::OnElemSegmentElemExpr_RefFunc
                                      (&this->validator_,&loc->loc,(Var *)local_830);
          Result::operator|=(&this->result_,(Result)local_7e8);
          Var::~Var((Var *)local_830);
        }
        __gnu_cxx::
        __normal_iterator<const_wabt::ElemExpr_*,_std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>_>
        ::operator++(&__end4);
      }
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_9.node_)
    ;
  }
  sVar31 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::size
                     (&pMVar1->data_segments);
  SharedValidator::OnDataCount(&this->validator_,(Index)sVar31);
  __range2_10._4_4_ = pMVar1->num_func_imports;
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&pMVar1->fields);
  cVar38 = intrusive_list<wabt::ModuleField>::end(&pMVar1->fields);
  while (bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                            ((const_iterator *)&__end2_10.node_,cVar38), bVar10) {
    pMVar32 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)&__end2_10.node_);
    pFVar33 = dyn_cast<wabt::FuncModuleField,wabt::ModuleField>(pMVar32);
    if (pFVar33 != (FuncModuleField *)0x0) {
      RVar14 = SharedValidator::BeginFunctionBody(&this->validator_,&pMVar32->loc,__range2_10._4_4_)
      ;
      Result::operator|=(&this->result_,RVar14);
      this_02 = LocalTypes::decls(&(pFVar33->func).local_types);
      __end4_1 = std::
                 vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                 ::begin(this_02);
      decl = (pair<wabt::Type,_unsigned_int> *)
             std::
             vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
             ::end(this_02);
      while (bVar10 = __gnu_cxx::operator!=
                                (&__end4_1,
                                 (__normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
                                  *)&decl), bVar10) {
        ppVar34 = __gnu_cxx::
                  __normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
                  ::operator*(&__end4_1);
        visitor.expr_iter_stack_.
        super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (ppVar34->first).enum_;
        visitor.expr_iter_stack_.
        super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             SharedValidator::OnLocalDecl
                       (&this->validator_,&pMVar32->loc,ppVar34->second,
                        visitor.expr_iter_stack_.
                        super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
        Result::operator|=(&this->result_,
                           visitor.expr_iter_stack_.
                           super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        __gnu_cxx::
        __normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
        ::operator++(&__end4_1);
      }
      ExprVisitor::ExprVisitor((ExprVisitor *)local_900,&this->super_Delegate);
      RVar14 = ExprVisitor::VisitExprList((ExprVisitor *)local_900,&(pFVar33->func).exprs);
      Result::operator|=(&this->result_,RVar14);
      RVar14 = SharedValidator::EndFunctionBody(&this->validator_,&pMVar32->loc);
      Result::operator|=(&this->result_,RVar14);
      ExprVisitor::~ExprVisitor((ExprVisitor *)local_900);
      __range2_10._4_4_ = __range2_10._4_4_ + 1;
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++
              ((const_iterator *)&__end2_10.node_);
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&pMVar1->fields);
  _local_930 = intrusive_list<wabt::ModuleField>::end(&pMVar1->fields);
  while( true ) {
    field_12 = (ModuleField *)local_930;
    local_938 = __end2_11.list_;
    bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                       ((const_iterator *)&__end2_11.node_,_local_930);
    if (!bVar10) break;
    f_11 = (DataSegmentModuleField *)
           intrusive_list<wabt::ModuleField>::const_iterator::operator*
                     ((const_iterator *)&__end2_11.node_);
    local_950 = dyn_cast<wabt::DataSegmentModuleField,wabt::ModuleField>((ModuleField *)f_11);
    if (local_950 != (DataSegmentModuleField *)0x0) {
      pMVar9 = &f_11->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>;
      Var::Var((Var *)&expr_2,&(local_950->data_segment).memory_var);
      local_954 = (Enum)SharedValidator::OnDataSegment
                                  (&this->validator_,&(pMVar9->super_ModuleField).loc,(Var *)&expr_2
                                   ,(local_950->data_segment).kind);
      Result::operator|=(&this->result_,(Result)local_954);
      Var::~Var((Var *)&expr_2);
      sVar31 = intrusive_list<wabt::Expr>::size(&(local_950->data_segment).offset);
      if (sVar31 == 1) {
        pvVar35 = intrusive_list<wabt::Expr>::front(&(local_950->data_segment).offset);
        EVar13 = Expr::type(pvVar35);
        if (EVar13 == Const) {
          pCVar36 = cast<wabt::ConstExpr,wabt::Expr>(pvVar35);
          var_2.field_2._24_4_ = Const::type(&pCVar36->const_);
          var_2.field_2._28_4_ =
               (Index)SharedValidator::OnDataSegmentInitExpr_Const
                                (&this->validator_,&pvVar35->loc,var_2.field_2._24_4_);
          Result::operator|=(&this->result_,(Result)var_2.field_2._28_4_);
        }
        else if (EVar13 == GlobalGet) {
          pVVar37 = cast<wabt::VarExpr<(wabt::ExprType)18>,wabt::Expr>(pvVar35);
          Var::Var((Var *)local_9f8,&pVVar37->var);
          Var::Var(&local_a48,(Var *)local_9f8);
          local_9fc = (Enum)SharedValidator::OnDataSegmentInitExpr_GlobalGet
                                      (&this->validator_,&pvVar35->loc,&local_a48);
          Result::operator|=(&this->result_,(Result)local_9fc);
          Var::~Var(&local_a48);
          Var::~Var((Var *)local_9f8);
        }
        else {
          RVar14 = SharedValidator::OnDataSegmentInitExpr_Other
                             (&this->validator_,
                              &(f_11->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).
                               super_ModuleField.loc);
          Result::operator|=(&this->result_,RVar14);
        }
      }
      else {
        sVar31 = intrusive_list<wabt::Expr>::size(&(local_950->data_segment).offset);
        if (1 < sVar31) {
          RVar14 = SharedValidator::OnDataSegmentInitExpr_Other
                             (&this->validator_,
                              &(f_11->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).
                               super_ModuleField.loc);
          Result::operator|=(&this->result_,RVar14);
        }
      }
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++
              ((const_iterator *)&__end2_11.node_);
  }
  RVar14 = SharedValidator::EndModule(&this->validator_);
  Result::operator|=(&this->result_,RVar14);
  return (Result)(this->result_).enum_;
}

Assistant:

Result Validator::CheckModule() {
  const Module* module = current_module_;

  // Type section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TypeModuleField>(&field)) {
      switch (f->type->kind()) {
        case TypeEntryKind::Func: {
          FuncType* func_type = cast<FuncType>(f->type.get());
          result_ |= validator_.OnFuncType(field.loc,
                                           func_type->sig.param_types.size(),
                                           func_type->sig.param_types.data(),
                                           func_type->sig.result_types.size(),
                                           func_type->sig.result_types.data());
          break;
        }

        case TypeEntryKind::Struct: {
          StructType* struct_type = cast<StructType>(f->type.get());
          TypeMutVector type_muts;
          for (auto&& field : struct_type->fields) {
            type_muts.push_back(TypeMut{field.type, field.mutable_});
          }
          result_ |= validator_.OnStructType(field.loc, type_muts.size(),
                                             type_muts.data());
          break;
        }

        case TypeEntryKind::Array: {
          ArrayType* array_type = cast<ArrayType>(f->type.get());
          result_ |= validator_.OnArrayType(
              field.loc,
              TypeMut{array_type->field.type, array_type->field.mutable_});
          break;
        }
      }
    }
  }

  // Import section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ImportModuleField>(&field)) {
      switch (f->import->kind()) {
        case ExternalKind::Func: {
          auto&& func = cast<FuncImport>(f->import.get())->func;
          result_ |= validator_.OnFunction(
              field.loc, GetFuncTypeIndex(field.loc, func.decl));
          break;
        }

        case ExternalKind::Table: {
          auto&& table = cast<TableImport>(f->import.get())->table;
          result_ |=
              validator_.OnTable(field.loc, table.elem_type, table.elem_limits);
          break;
        }

        case ExternalKind::Memory: {
          auto&& memory = cast<MemoryImport>(f->import.get())->memory;
          result_ |= validator_.OnMemory(field.loc, memory.page_limits);
          break;
        }

        case ExternalKind::Global: {
          auto&& global = cast<GlobalImport>(f->import.get())->global;
          result_ |= validator_.OnGlobalImport(field.loc, global.type,
                                               global.mutable_);
          break;
        }

        case ExternalKind::Event: {
          auto&& event = cast<EventImport>(f->import.get())->event;
          result_ |= validator_.OnEvent(
              field.loc, GetFuncTypeIndex(field.loc, event.decl));
          break;
        }
      }
    }
  }

  // Func section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      result_ |= validator_.OnFunction(
          field.loc, GetFuncTypeIndex(field.loc, f->func.decl));
    }
  }

  // Table section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TableModuleField>(&field)) {
      result_ |= validator_.OnTable(field.loc, f->table.elem_type,
                                    f->table.elem_limits);
    }
  }

  // Memory section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<MemoryModuleField>(&field)) {
      result_ |= validator_.OnMemory(field.loc, f->memory.page_limits);
    }
  }

  // Global section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<GlobalModuleField>(&field)) {
      result_ |=
          validator_.OnGlobal(field.loc, f->global.type, f->global.mutable_);

      if (f->global.init_expr.size() == 1) {
        const Expr* expr = &f->global.init_expr.front();

        switch (expr->type()) {
          case ExprType::Const:
            result_ |= validator_.OnGlobalInitExpr_Const(
                expr->loc, cast<ConstExpr>(expr)->const_.type());
            break;

          case ExprType::GlobalGet: {
            Var var = cast<GlobalGetExpr>(expr)->var;
            result_ |= validator_.OnGlobalInitExpr_GlobalGet(expr->loc, var);
            break;
          }

          case ExprType::RefFunc:
            result_ |= validator_.OnGlobalInitExpr_RefFunc(
                expr->loc, cast<RefFuncExpr>(expr)->var);
            break;

          case ExprType::RefNull:
            result_ |= validator_.OnGlobalInitExpr_RefNull(expr->loc);
            break;

          default:
            result_ |= validator_.OnGlobalInitExpr_Other(field.loc);
            break;
        }
      } else {
        result_ |= validator_.OnGlobalInitExpr_Other(field.loc);
      }
    }
  }

  // Event section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<EventModuleField>(&field)) {
      result_ |= validator_.OnEvent(field.loc,
                                    GetFuncTypeIndex(field.loc, f->event.decl));
    }
  }

  // Export section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ExportModuleField>(&field)) {
      result_ |= validator_.OnExport(field.loc, f->export_.kind, f->export_.var,
                                     f->export_.name);
    }
  }

  // Start section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<StartModuleField>(&field)) {
      result_ |= validator_.OnStart(field.loc, f->start);
    }
  }

  // Elem segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ElemSegmentModuleField>(&field)) {
      result_ |= validator_.OnElemSegment(field.loc, f->elem_segment.table_var,
                                          f->elem_segment.kind);

      validator_.OnElemSegmentElemType(f->elem_segment.elem_type);

      // Init expr.
      if (f->elem_segment.offset.size() == 1) {
        const Expr* expr = &f->elem_segment.offset.front();

        switch (expr->type()) {
          case ExprType::Const:
            result_ |= validator_.OnElemSegmentInitExpr_Const(
                expr->loc, cast<ConstExpr>(expr)->const_.type());
            break;

          case ExprType::GlobalGet: {
            Var var = cast<GlobalGetExpr>(expr)->var;
            result_ |=
                validator_.OnElemSegmentInitExpr_GlobalGet(expr->loc, var);
            break;
          }

          default:
            result_ |= validator_.OnElemSegmentInitExpr_Other(field.loc);
            break;
        }
      } else if (f->elem_segment.offset.size() > 1) {
        result_ |= validator_.OnElemSegmentInitExpr_Other(field.loc);
      }

      // Element expr.
      for (auto&& elem_expr : f->elem_segment.elem_exprs) {
        switch (elem_expr.kind) {
          case ElemExprKind::RefNull:
            // TODO: better location?
            result_ |= validator_.OnElemSegmentElemExpr_RefNull(field.loc);
            break;

          case ElemExprKind::RefFunc:
            result_ |= validator_.OnElemSegmentElemExpr_RefFunc(
                elem_expr.var.loc, elem_expr.var);
            break;
        }
      }
    }
  }

  // DataCount section.
  validator_.OnDataCount(module->data_segments.size());

  // Code section.
  Index func_index = module->num_func_imports;
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      result_ |= validator_.BeginFunctionBody(field.loc, func_index++);

      for (auto&& decl : f->func.local_types.decls()) {
        // TODO: Better location?
        result_ |= validator_.OnLocalDecl(field.loc, decl.second, decl.first);
      }

      ExprVisitor visitor(this);
      result_ |= visitor.VisitExprList(const_cast<ExprList&>(f->func.exprs));
      result_ |= validator_.EndFunctionBody(field.loc);
    }
  }

  // Data segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<DataSegmentModuleField>(&field)) {
      result_ |= validator_.OnDataSegment(
          field.loc, f->data_segment.memory_var, f->data_segment.kind);

      // Init expr.
      if (f->data_segment.offset.size() == 1) {
        const Expr* expr = &f->data_segment.offset.front();

        switch (expr->type()) {
          case ExprType::Const:
            result_ |= validator_.OnDataSegmentInitExpr_Const(
                expr->loc, cast<ConstExpr>(expr)->const_.type());
            break;

          case ExprType::GlobalGet: {
            Var var = cast<GlobalGetExpr>(expr)->var;
            result_ |=
                validator_.OnDataSegmentInitExpr_GlobalGet(expr->loc, var);
            break;
          }

          default:
            result_ |= validator_.OnDataSegmentInitExpr_Other(field.loc);
            break;
        }
      } else if (f->data_segment.offset.size() > 1) {
        result_ |= validator_.OnDataSegmentInitExpr_Other(field.loc);
      }
    }
  }

  result_ |= validator_.EndModule();

  return result_;
}